

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<bool,_bool>::streamReconstructedExpression
          (BinaryExpr<bool,_bool> *this,ostream *os)

{
  string *lhs;
  ulong uVar1;
  char *pcVar2;
  string *in_R9;
  char *pcVar3;
  StringRef op;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = (ulong)(byte)(this->super_ITransientExpression).field_0xa;
  pcVar3 = "false";
  pcVar2 = "false";
  if (uVar1 != 0) {
    pcVar2 = "true";
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar2,pcVar2 + (uVar1 ^ 5));
  lhs = (string *)(this->m_op).m_start;
  pcVar2 = (char *)(this->m_op).m_size;
  if ((ulong)this->m_rhs != 0) {
    pcVar3 = "true";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar3,pcVar3 + ((ulong)this->m_rhs ^ 5));
  op.m_size = (size_type)local_50;
  op.m_start = pcVar2;
  formatReconstructedExpression((Catch *)os,(ostream *)local_70,lhs,op,in_R9);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }